

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

void Bmc_ComputeSimTest(Gia_Man_t *p)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *vPat2;
  Vec_Wrd_t *pVVar5;
  word *__s;
  ulong uVar6;
  undefined1 *puVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  uint *puVar17;
  int DiffCount [64];
  int PatCount [64] [2] [2];
  int Count [2] [64] [64];
  uint local_8538 [64];
  uint local_8438 [256];
  undefined1 local_8038 [32776];
  
  piVar4 = (int *)0x0;
  memset(local_8038,0,0x8000);
  puVar17 = local_8438;
  memset(puVar17,0,0x400);
  memset(local_8538,0,0x100);
  iVar16 = p->vCis->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar8 = iVar16;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 != 0) {
    piVar4 = (int *)malloc((long)iVar8 * 4);
  }
  p_00->pArray = piVar4;
  vPat2 = (Vec_Int_t *)malloc(0x10);
  vPat2->nSize = 0;
  vPat2->nCap = iVar8;
  if (iVar8 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar8 << 2);
  }
  vPat2->pArray = piVar4;
  pVVar5 = p->vSims;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vSims->pArray = (word *)0x0;
      pVVar5 = p->vSims;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_0052eb1f;
    }
    free(pVVar5);
  }
LAB_0052eb1f:
  iVar16 = p->nObjs;
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar8 = iVar16;
  }
  pVVar5->nCap = iVar8;
  iVar9 = 0;
  if (iVar8 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar8 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar16;
  memset(__s,0,(long)iVar16 << 3);
  p->vSims = pVVar5;
  printf("Number of patterns = %d.\n",0x100);
  do {
    p_00->nSize = 0;
    if (0 < p->vCis->nSize) {
      iVar16 = 0;
      do {
        uVar3 = rand();
        Vec_IntPush(p_00,uVar3 & 1);
        iVar16 = iVar16 + 1;
      } while (iVar16 < p->vCis->nSize);
    }
    uVar3 = Bmc_ComputeSimDiff(p,p_00,vPat2);
    iVar16 = p_00->nSize;
    if (0 < (long)iVar16) {
      piVar4 = p_00->pArray;
      lVar11 = 0;
      do {
        local_8438[(ulong)uVar3 * 2 + *(int *)((long)piVar4 + lVar11) + lVar11] =
             local_8438[(ulong)uVar3 * 2 + *(int *)((long)piVar4 + lVar11) + lVar11] + 1;
        lVar11 = lVar11 + 4;
      } while ((long)iVar16 * 4 != lVar11);
    }
    uVar6 = (ulong)vPat2->nSize;
    if (0 < (long)uVar6) {
      piVar4 = vPat2->pArray;
      puVar7 = local_8038 + (ulong)uVar3 * 0x4000;
      uVar13 = 0;
      uVar10 = uVar6;
      piVar12 = piVar4;
      do {
        iVar16 = piVar4[uVar13];
        if (iVar16 != 0) {
          local_8538[uVar13] = local_8538[uVar13] + 1;
        }
        uVar13 = uVar13 + 1;
        if (uVar13 < uVar6) {
          uVar14 = 1;
          do {
            if ((iVar16 != 0) && (piVar12[uVar14] != 0)) {
              *(int *)(puVar7 + uVar14 * 4) = *(int *)(puVar7 + uVar14 * 4) + 1;
            }
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
        }
        piVar12 = piVar12 + 1;
        puVar7 = puVar7 + 0x104;
        uVar10 = uVar10 - 1;
      } while (uVar13 != uVar6);
    }
    iVar9 = iVar9 + 1;
  } while (iVar9 != 0x100);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (vPat2->pArray != (int *)0x0) {
    free(vPat2->pArray);
  }
  free(vPat2);
  pVVar5 = p->vSims;
  if (pVVar5 != (Vec_Wrd_t *)0x0) {
    if (pVVar5->pArray != (word *)0x0) {
      free(pVVar5->pArray);
      p->vSims->pArray = (word *)0x0;
      pVVar5 = p->vSims;
      if (pVVar5 == (Vec_Wrd_t *)0x0) goto LAB_0052ed00;
    }
    free(pVVar5);
    p->vSims = (Vec_Wrd_t *)0x0;
  }
LAB_0052ed00:
  putchar(10);
  printf("      ");
  if (0 < p->vCis->nSize) {
    iVar16 = 0;
    do {
      printf("%3c ",(ulong)(iVar16 + 0x61));
      iVar16 = iVar16 + 1;
    } while (iVar16 < p->vCis->nSize);
  }
  putchar(10);
  printf("Off0  ");
  if (0 < p->vCis->nSize) {
    lVar11 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar11 = lVar11 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar11 < p->vCis->nSize);
  }
  putchar(10);
  printf("Off1  ");
  if (0 < p->vCis->nSize) {
    puVar17 = local_8438 + 1;
    lVar11 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar11 = lVar11 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar11 < p->vCis->nSize);
  }
  putchar(10);
  printf("On0   ");
  if (0 < p->vCis->nSize) {
    puVar17 = local_8438 + 2;
    lVar11 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar11 = lVar11 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar11 < p->vCis->nSize);
  }
  putchar(10);
  printf("On1   ");
  if (0 < p->vCis->nSize) {
    puVar17 = local_8438 + 3;
    lVar11 = 0;
    do {
      printf("%3d ",(ulong)*puVar17);
      lVar11 = lVar11 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar11 < p->vCis->nSize);
  }
  putchar(10);
  putchar(10);
  printf("Diff  ");
  if (0 < p->vCis->nSize) {
    lVar11 = 0;
    do {
      printf("%3d ",(ulong)local_8538[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < p->vCis->nSize);
  }
  putchar(10);
  putchar(10);
  lVar11 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    printf("      ");
    if (0 < p->vCis->nSize) {
      iVar16 = 0;
      do {
        printf("%3c ",(ulong)(iVar16 + 0x61));
        iVar16 = iVar16 + 1;
      } while (iVar16 < p->vCis->nSize);
    }
    putchar(10);
    if (0 < p->vCis->nSize) {
      puVar7 = local_8038 + lVar11 * 0x4000;
      lVar11 = 0;
      do {
        printf(" %c    ",(ulong)((int)lVar11 + 0x61));
        if (0 < p->vCis->nSize) {
          lVar15 = 0;
          do {
            if (*(int *)(puVar7 + lVar15 * 4) == 0) {
              printf("  . ");
            }
            else {
              printf("%3d ");
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < p->vCis->nSize);
        }
        putchar(10);
        lVar11 = lVar11 + 1;
        puVar7 = puVar7 + 0x100;
      } while (lVar11 < p->vCis->nSize);
    }
    putchar(10);
    lVar11 = 1;
    bVar1 = false;
  } while (bVar2);
  return;
}

Assistant:

void Bmc_ComputeSimTest( Gia_Man_t * p )
{
    int i, v, w, Res, Bit, Bit2, nPats = 256;
    int Count[2][64][64] = {{{0}}};
    int PatCount[64][2][2] = {{{0}}};
    int DiffCount[64] = {0};
    Vec_Int_t * vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_Int_t * vPat2 = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) );
    printf( "Number of patterns = %d.\n", nPats );
    for ( i = 0; i < nPats; i++ )
    {
        Vec_IntClear( vPat );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            Vec_IntPush( vPat, rand() & 1 );

//        Vec_IntForEachEntry( vPat, Bit, v )
//            printf( "%d", Bit );
//        printf( "    " );

        Res = Bmc_ComputeSimDiff( p, vPat, vPat2 );
//        printf( "%d ", Res );

//        Vec_IntForEachEntry( vPat2, Bit, v )
//            printf( "%d", Bit );
//        printf( "\n" );

        Vec_IntForEachEntry( vPat, Bit, v )
            PatCount[v][Res][Bit]++;

        Vec_IntForEachEntry( vPat2, Bit, v )
        {
            if ( Bit )
                DiffCount[v]++;
            Vec_IntForEachEntryStart( vPat2, Bit2, w, v + 1 )
                if ( Bit && Bit2 )
                    Count[Res][v][w]++;
        }
    }
    Vec_IntFree( vPat );
    Vec_IntFree( vPat2 );
    Vec_WrdFreeP( &p->vSims );


    printf( "\n" );
    printf( "      " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3c ", 'a'+v );
    printf( "\n" );

    printf( "Off0  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][0] );
    printf( "\n" );

    printf( "Off1  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][1] );
    printf( "\n" );

    printf( "On0   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][0] );
    printf( "\n" );

    printf( "On1   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][1] );
    printf( "\n" );
    printf( "\n" );

    printf( "Diff  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", DiffCount[v] );
    printf( "\n" );
    printf( "\n" );

    for ( i = 0; i < 2; i++ )
    {
        printf( "      " );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            printf( "%3c ", 'a'+v );
        printf( "\n" );

        for ( v = 0; v < Gia_ManCiNum(p); v++ )
        {
            printf( " %c    ", 'a'+v );
            for ( w = 0; w < Gia_ManCiNum(p); w++ )
            {
                if ( Count[i][v][w] )
                    printf( "%3d ", Count[i][v][w] );
                else
                    printf( "  . " );
            }
            printf( "\n" );
        }
        printf( "\n" );
    }
}